

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
start_worker_if_needed(TRANSPORT_HANDLE_DATA *transportData,IOTHUB_CLIENT_CORE_HANDLE clientHandle)

{
  THREADAPI_RESULT TVar1;
  LOCK_RESULT LVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  size_t sVar5;
  void *pvVar6;
  bool bVar7;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  _Bool addToList;
  LOGGER_LOG l;
  IOTHUB_CLIENT_CORE_HANDLE pIStack_18;
  IOTHUB_CLIENT_RESULT result;
  IOTHUB_CLIENT_CORE_HANDLE clientHandle_local;
  TRANSPORT_HANDLE_DATA *transportData_local;
  
  pIStack_18 = clientHandle;
  clientHandle_local = (IOTHUB_CLIENT_CORE_HANDLE)transportData;
  if (transportData->workerThreadHandle == (THREAD_HANDLE)0x0) {
    transportData->stopThread = 0;
    TVar1 = ThreadAPI_Create(&transportData->workerThreadHandle,transport_worker_thread,
                             transportData);
    if (TVar1 != THREADAPI_OK) {
      *(undefined8 *)(clientHandle_local + 8) = 0;
    }
  }
  if (*(long *)(clientHandle_local + 8) == 0) {
    l._4_4_ = IOTHUB_CLIENT_ERROR;
  }
  else {
    LVar2 = Lock(*(LOCK_HANDLE *)(clientHandle_local + 0xe0));
    if (LVar2 == LOCK_OK) {
      sVar5 = VECTOR_size(*(VECTOR_HANDLE *)(clientHandle_local + 0xd8));
      bVar7 = true;
      if (sVar5 != 0) {
        pvVar6 = VECTOR_find_if(*(VECTOR_HANDLE *)(clientHandle_local + 0xd8),find_by_handle,
                                pIStack_18);
        bVar7 = pvVar6 == (void *)0x0;
      }
      if (bVar7) {
        iVar3 = VECTOR_push_back(*(VECTOR_HANDLE *)(clientHandle_local + 0xd8),
                                 &stack0xffffffffffffffe8,1);
        if (iVar3 == 0) {
          l._4_4_ = IOTHUB_CLIENT_OK;
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                      ,"start_worker_if_needed",0xe5,1,
                      "Failed adding device to list (VECTOR_push_back failed)");
          }
          l._4_4_ = IOTHUB_CLIENT_ERROR;
        }
      }
      else {
        l._4_4_ = IOTHUB_CLIENT_OK;
      }
      LVar2 = Unlock(*(LOCK_HANDLE *)(clientHandle_local + 0xe0));
      if ((LVar2 != LOCK_OK) && (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0)) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                  ,"start_worker_if_needed",0xf4,1,"failed to unlock on start_worker_if_needed");
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                  ,"start_worker_if_needed",0xdb,1,"failed to lock for start_worker_if_needed");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

static IOTHUB_CLIENT_RESULT start_worker_if_needed(TRANSPORT_HANDLE_DATA * transportData, IOTHUB_CLIENT_CORE_HANDLE clientHandle)
{
    IOTHUB_CLIENT_RESULT result;
    if (transportData->workerThreadHandle == NULL)
    {
        transportData->stopThread = 0;
        if (ThreadAPI_Create(&transportData->workerThreadHandle, transport_worker_thread, transportData) != THREADAPI_OK)
        {
            transportData->workerThreadHandle = NULL;
        }
    }
    if (transportData->workerThreadHandle != NULL)
    {
        if (Lock(transportData->clientsLockHandle) != LOCK_OK)
        {
            LogError("failed to lock for start_worker_if_needed");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            bool addToList = ((VECTOR_size(transportData->clients) == 0) || (VECTOR_find_if(transportData->clients, find_by_handle, clientHandle) == NULL));
            if (addToList)
            {
                if (VECTOR_push_back(transportData->clients, &clientHandle, 1) != 0)
                {
                    LogError("Failed adding device to list (VECTOR_push_back failed)");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    result = IOTHUB_CLIENT_OK;
                }
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }

            if (Unlock(transportData->clientsLockHandle) != LOCK_OK)
            {
                LogError("failed to unlock on start_worker_if_needed");
            }
        }
    }
    else
    {
        result = IOTHUB_CLIENT_ERROR;
    }
    return result;
}